

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution2d.cpp
# Opt level: O2

int __thiscall embree::Distribution2D::init(Distribution2D *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  size_t x;
  ulong uVar1;
  size_type in_RCX;
  size_t in_RDX;
  EVP_PKEY_CTX *pEVar2;
  ulong uVar3;
  vector<float,_std::allocator<float>_> fy;
  allocator_type local_49;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  this->width = in_RDX;
  this->height = in_RCX;
  std::vector<embree::Distribution1D,_std::allocator<embree::Distribution1D>_>::resize
            (&this->xDists,in_RCX);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_48,this->height,&local_49);
  pEVar2 = ctx;
  for (uVar3 = 0; uVar3 < this->height; uVar3 = uVar3 + 1) {
    *(undefined4 *)((long)local_48._M_impl.super__Vector_impl_data._M_start + uVar3 * 4) = 0;
    for (uVar1 = 0; uVar1 < this->width; uVar1 = uVar1 + 1) {
      *(float *)((long)local_48._M_impl.super__Vector_impl_data._M_start + uVar3 * 4) =
           *(float *)(pEVar2 + uVar1 * 4) +
           *(float *)((long)local_48._M_impl.super__Vector_impl_data._M_start + uVar3 * 4);
    }
    Distribution1D::init
              ((this->xDists).
               super__Vector_base<embree::Distribution1D,_std::allocator<embree::Distribution1D>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar3,ctx + this->width * uVar3 * 4);
    pEVar2 = pEVar2 + in_RDX * 4;
  }
  Distribution1D::init
            (&this->yDist,(EVP_PKEY_CTX *)local_48._M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  return extraout_EAX;
}

Assistant:

void Distribution2D::init(const float* f, const size_t w, const size_t h)
  {
    /*! create arrays */
    width = w; height = h;
    xDists.resize(height);
    std::vector<float> fy(height);

    /*! compute y distribution and initialize row distributions */
    for (size_t y=0; y<height; y++)
    {
      /*! accumulate row to compute y distribution */
      fy[y] = 0.0f;
      for (size_t x=0; x<width; x++)
        fy[y] += f[y*w+x];

      /*! initialize distribution for current row */
      xDists[y].init(f+y*width, width);
    }

    /*! initializes the y distribution */
    yDist.init(fy.data(), height);
  }